

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O0

void * array_create(int initsize,int elemsize)

{
  int *piVar1;
  uint in_ESI;
  int in_EDI;
  array_t *handle;
  
  piVar1 = (int *)malloc((long)(int)in_ESI * (long)in_EDI + 8);
  *piVar1 = in_EDI;
  piVar1[1] = piVar1[1] & 0xfffffff0U | in_ESI & 0xf;
  piVar1[1] = piVar1[1] & 0xf;
  return piVar1 + 2;
}

Assistant:

void *
array_create(
    int initsize,
    int elemsize )
{
    array_t * handle;
    handle = (array_t *)malloc( sizeof(array_t) + (size_t)elemsize * initsize );
    assert( handle != NULL );
    handle->size = initsize;
    handle->elemsize = elemsize;
    handle->numelem = 0;
    return _ARRAY(handle);
}